

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_11x11(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  DCTELEM in_EDX;
  undefined8 in_RSI;
  int *in_RDI;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp5;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_104;
  int *local_f8;
  int *local_f0;
  int local_e8 [8];
  int local_c8 [8];
  int local_a8 [8];
  long local_88;
  long lStack_80;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *wsptr;
  DCTELEM *dataptr;
  DCTELEM workspace [24];
  
  local_104 = 0;
  local_f0 = in_RDI;
  workspace[0x13] = in_EDX;
  workspace._80_8_ = in_RSI;
  workspace._88_8_ = in_RDI;
  while( true ) {
    while( true ) {
      pbVar5 = (byte *)(*(long *)(workspace._80_8_ + (long)local_104 * 8) +
                       (ulong)(uint)workspace[0x13]);
      workspace._64_8_ = SEXT48((int)((uint)*pbVar5 + (uint)pbVar5[10]));
      workspace._56_8_ = SEXT48((int)((uint)pbVar5[1] + (uint)pbVar5[9]));
      workspace._48_8_ = SEXT48((int)((uint)pbVar5[2] + (uint)pbVar5[8]));
      workspace._40_8_ = SEXT48((int)((uint)pbVar5[3] + (uint)pbVar5[7]));
      workspace._32_8_ = SEXT48((int)((uint)pbVar5[4] + (uint)pbVar5[6]));
      workspace._24_8_ = SEXT48((int)(uint)pbVar5[5]);
      workspace._16_8_ = SEXT48((int)((uint)*pbVar5 - (uint)pbVar5[10]));
      workspace._8_8_ = SEXT48((int)((uint)pbVar5[1] - (uint)pbVar5[9]));
      workspace._0_8_ = SEXT48((int)((uint)pbVar5[2] - (uint)pbVar5[8]));
      dataptr = (DCTELEM *)(long)(int)((uint)pbVar5[3] - (uint)pbVar5[7]);
      wsptr = (DCTELEM *)(long)(int)((uint)pbVar5[4] - (uint)pbVar5[6]);
      *local_f0 = ((uint)*pbVar5 + (uint)pbVar5[10] + (uint)pbVar5[1] + (uint)pbVar5[9] +
                   (uint)pbVar5[2] + (uint)pbVar5[8] + (uint)pbVar5[3] + (uint)pbVar5[7] +
                   (uint)pbVar5[4] + (uint)pbVar5[6] + (uint)pbVar5[5] + -0x580) * 2;
      workspace._64_8_ = workspace._64_8_ + workspace._24_8_ * -2;
      workspace._56_8_ = workspace._56_8_ + workspace._24_8_ * -2;
      workspace._48_8_ = workspace._48_8_ + workspace._24_8_ * -2;
      lVar6 = workspace._40_8_ + workspace._24_8_ * -2;
      workspace._32_8_ = workspace._32_8_ + workspace._24_8_ * -2;
      elemptr = (JSAMPROW)
                ((workspace._64_8_ + lVar6) * 0x2b6c + (workspace._48_8_ + workspace._32_8_) * 0x671
                );
      lStack_80 = (workspace._56_8_ - lVar6) * 0x1da3;
      local_88 = (workspace._64_8_ - workspace._56_8_) * 0x2612;
      local_f0[2] = (int)((long)(elemptr +
                                workspace._32_8_ * -0x2c83 + lVar6 * -0x2096 + lStack_80 + 0x800) >>
                         0xc);
      local_f0[4] = (int)(lStack_80 + local_88 + workspace._56_8_ * 0x1ff +
                          workspace._48_8_ * -0x2b6c + workspace._32_8_ * 0x12cd + 0x800 >> 0xc);
      local_f0[6] = (int)((long)(elemptr +
                                workspace._48_8_ * -0x193d + workspace._64_8_ * -0x33db + local_88 +
                                0x800) >> 0xc);
      lVar6 = (workspace._16_8_ + workspace._8_8_) * 0x292a;
      lVar7 = (workspace._16_8_ + workspace._0_8_) * 0x2234;
      lVar8 = (workspace._16_8_ + (long)dataptr) * 0x1877;
      lVar9 = (workspace._8_8_ + workspace._0_8_) * -0x1877;
      lVar10 = (workspace._8_8_ + (long)dataptr) * -0x2ccb;
      workspace._56_8_ = lVar9 + lVar10 + workspace._8_8_ * 0x28d8 + (long)wsptr * -0x2234 + lVar6;
      lVar11 = (workspace._0_8_ + (long)dataptr) * 0xcc0;
      workspace._48_8_ = lVar9 + lVar11 + workspace._0_8_ * -0x3fa6 + (long)wsptr * 0x2ccb + lVar7;
      workspace._40_8_ = lVar10 + lVar11 + (long)dataptr * 0x29c7 + (long)wsptr * -0x292a + lVar8;
      local_f0[1] = (int)(lVar6 + lVar7 + lVar8 + workspace._16_8_ * -0x370a + (long)wsptr * 0xcc0 +
                          0x800 >> 0xc);
      local_f0[3] = (int)(workspace._56_8_ + 0x800 >> 0xc);
      local_f0[5] = (int)(workspace._48_8_ + 0x800 >> 0xc);
      local_f0[7] = (int)(workspace._40_8_ + 0x800 >> 0xc);
      local_104 = local_104 + 1;
      if (local_104 != 8) break;
      local_f0 = local_e8;
    }
    if (local_104 == 0xb) break;
    local_f0 = local_f0 + 8;
  }
  local_f0 = (int *)workspace._88_8_;
  local_f8 = local_e8;
  for (local_104 = 7; -1 < local_104; local_104 = local_104 + -1) {
    iVar1 = *local_f0;
    iVar2 = local_f8[0x10];
    iVar3 = local_f8[8];
    iVar4 = *local_f8;
    lVar6 = (long)local_f0[0x28];
    lVar7 = (long)(*local_f0 - local_f8[0x10]);
    lVar8 = (long)(local_f0[8] - local_f8[8]);
    lVar9 = (long)(local_f0[0x10] - *local_f8);
    lVar10 = (long)(local_f0[0x18] - local_f0[0x38]);
    lVar11 = (long)(local_f0[0x20] - local_f0[0x30]);
    *local_f0 = (int)(((long)(iVar1 + iVar2) + (long)(local_f0[8] + iVar3) +
                       (long)(local_f0[0x10] + iVar4) + (long)(local_f0[0x18] + local_f0[0x38]) +
                       (long)(local_f0[0x20] + local_f0[0x30]) + lVar6) * 0x21da + 0x4000 >> 0xf);
    lVar12 = (long)(iVar1 + iVar2) + lVar6 * -2;
    lVar13 = (long)(local_f0[8] + iVar3) + lVar6 * -2;
    lVar14 = (long)(local_f0[0x10] + iVar4) + lVar6 * -2;
    lVar15 = (long)(local_f0[0x18] + local_f0[0x38]) + lVar6 * -2;
    lVar6 = (long)(local_f0[0x20] + local_f0[0x30]) + lVar6 * -2;
    lVar16 = (lVar12 + lVar15) * 0x2def + (lVar14 + lVar6) * 0x6d0;
    lVar17 = (lVar13 - lVar15) * 0x1f5a;
    lVar18 = (lVar12 - lVar13) * 0x2846;
    local_f0[0x10] = (int)(lVar16 + lVar17 + lVar15 * -0x2279 + lVar6 * -0x2f16 + 0x4000 >> 0xf);
    local_f0[0x20] =
         (int)(lVar17 + lVar18 + lVar13 * 0x21c + lVar14 * -0x2def + lVar6 * 0x13e3 + 0x4000 >> 0xf)
    ;
    local_f0[0x30] = (int)(lVar16 + lVar18 + lVar12 * -0x36db + lVar14 * -0x1ab3 + 0x4000 >> 0xf);
    lVar6 = (lVar7 + lVar8) * 0x2b8c;
    lVar12 = (lVar7 + lVar9) * 0x242e;
    lVar13 = (lVar7 + lVar10) * 0x19e2;
    lVar14 = (lVar8 + lVar9) * -0x19e2;
    lVar15 = (lVar8 + lVar10) * -0x2f63;
    lVar16 = (lVar9 + lVar10) * 0xd7d;
    local_f0[8] = (int)(lVar6 + lVar12 + lVar13 + lVar7 * -0x3a39 + lVar11 * 0xd7d + 0x4000 >> 0xf);
    local_f0[0x18] =
         (int)(lVar14 + lVar15 + lVar8 * 0x2b35 + lVar11 * -0x242e + lVar6 + 0x4000 >> 0xf);
    local_f0[0x28] =
         (int)(lVar14 + lVar16 + lVar9 * -0x4355 + lVar11 * 0x2f63 + lVar12 + 0x4000 >> 0xf);
    local_f0[0x38] =
         (int)(lVar15 + lVar16 + lVar10 * 0x2c32 + lVar11 * -0x2b8c + lVar13 + 0x4000 >> 0xf);
    local_f0 = local_f0 + 1;
    local_f8 = local_f8 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_11x11 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  INT32 z1, z2, z3;
  DCTELEM workspace[8*3];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* we scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/22). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[10]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[9]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[8]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[7]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[6]);
    tmp5 = GETJSAMPLE(elemptr[5]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[10]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[9]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[8]);
    tmp13 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[7]);
    tmp14 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[6]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 - 11 * CENTERJSAMPLE) << 1);
    tmp5 += tmp5;
    tmp0 -= tmp5;
    tmp1 -= tmp5;
    tmp2 -= tmp5;
    tmp3 -= tmp5;
    tmp4 -= tmp5;
    z1 = MULTIPLY(tmp0 + tmp3, FIX(1.356927976)) +       /* c2 */
	 MULTIPLY(tmp2 + tmp4, FIX(0.201263574));        /* c10 */
    z2 = MULTIPLY(tmp1 - tmp3, FIX(0.926112931));        /* c6 */
    z3 = MULTIPLY(tmp0 - tmp1, FIX(1.189712156));        /* c4 */
    dataptr[2] = (DCTELEM)
      DESCALE(z1 + z2 - MULTIPLY(tmp3, FIX(1.018300590)) /* c2+c8-c6 */
	      - MULTIPLY(tmp4, FIX(1.390975730)),        /* c4+c10 */
	      CONST_BITS-1);
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 + MULTIPLY(tmp1, FIX(0.062335650)) /* c4-c6-c10 */
	      - MULTIPLY(tmp2, FIX(1.356927976))         /* c2 */
	      + MULTIPLY(tmp4, FIX(0.587485545)),        /* c8 */
	      CONST_BITS-1);
    dataptr[6] = (DCTELEM)
      DESCALE(z1 + z3 - MULTIPLY(tmp0, FIX(1.620527200)) /* c2+c4-c6 */
	      - MULTIPLY(tmp2, FIX(0.788749120)),        /* c8+c10 */
	      CONST_BITS-1);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.286413905));    /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.068791298));    /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.764581576));    /* c7 */
    tmp0 = tmp1 + tmp2 + tmp3 - MULTIPLY(tmp10, FIX(1.719967871)) /* c7+c5+c3-c1 */
	   + MULTIPLY(tmp14, FIX(0.398430003));          /* c9 */
    tmp4 = MULTIPLY(tmp11 + tmp12, - FIX(0.764581576));  /* -c7 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.399818907));  /* -c1 */
    tmp1 += tmp4 + tmp5 + MULTIPLY(tmp11, FIX(1.276416582)) /* c9+c7+c1-c3 */
	    - MULTIPLY(tmp14, FIX(1.068791298));         /* c5 */
    tmp10 = MULTIPLY(tmp12 + tmp13, FIX(0.398430003));   /* c9 */
    tmp2 += tmp4 + tmp10 - MULTIPLY(tmp12, FIX(1.989053629)) /* c9+c5+c3-c7 */
	    + MULTIPLY(tmp14, FIX(1.399818907));         /* c1 */
    tmp3 += tmp5 + tmp10 + MULTIPLY(tmp13, FIX(1.305598626)) /* c1+c5-c9-c7 */
	    - MULTIPLY(tmp14, FIX(1.286413905));         /* c3 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-1);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-1);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-1);
    dataptr[7] = (DCTELEM) DESCALE(tmp3, CONST_BITS-1);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 11)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/11)**2 = 64/121, which we partially
   * fold into the constant multipliers and final/initial shifting:
   * cK now represents sqrt(2) * cos(K*pi/22) * 128/121.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*2];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*1];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*0];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*7];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*6];
    tmp5 = dataptr[DCTSIZE*5];

    tmp10 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*2];
    tmp11 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*1];
    tmp12 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*0];
    tmp13 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*7];
    tmp14 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*6];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5,
		       FIX(1.057851240)),                /* 128/121 */
	      CONST_BITS+2);
    tmp5 += tmp5;
    tmp0 -= tmp5;
    tmp1 -= tmp5;
    tmp2 -= tmp5;
    tmp3 -= tmp5;
    tmp4 -= tmp5;
    z1 = MULTIPLY(tmp0 + tmp3, FIX(1.435427942)) +       /* c2 */
	 MULTIPLY(tmp2 + tmp4, FIX(0.212906922));        /* c10 */
    z2 = MULTIPLY(tmp1 - tmp3, FIX(0.979689713));        /* c6 */
    z3 = MULTIPLY(tmp0 - tmp1, FIX(1.258538479));        /* c4 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(z1 + z2 - MULTIPLY(tmp3, FIX(1.077210542)) /* c2+c8-c6 */
	      - MULTIPLY(tmp4, FIX(1.471445400)),        /* c4+c10 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(z2 + z3 + MULTIPLY(tmp1, FIX(0.065941844)) /* c4-c6-c10 */
	      - MULTIPLY(tmp2, FIX(1.435427942))         /* c2 */
	      + MULTIPLY(tmp4, FIX(0.621472312)),        /* c8 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(z1 + z3 - MULTIPLY(tmp0, FIX(1.714276708)) /* c2+c4-c6 */
	      - MULTIPLY(tmp2, FIX(0.834379234)),        /* c8+c10 */
	      CONST_BITS+2);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.360834544));    /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.130622199));    /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.808813568));    /* c7 */
    tmp0 = tmp1 + tmp2 + tmp3 - MULTIPLY(tmp10, FIX(1.819470145)) /* c7+c5+c3-c1 */
	   + MULTIPLY(tmp14, FIX(0.421479672));          /* c9 */
    tmp4 = MULTIPLY(tmp11 + tmp12, - FIX(0.808813568));  /* -c7 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.480800167));  /* -c1 */
    tmp1 += tmp4 + tmp5 + MULTIPLY(tmp11, FIX(1.350258864)) /* c9+c7+c1-c3 */
	    - MULTIPLY(tmp14, FIX(1.130622199));         /* c5 */
    tmp10 = MULTIPLY(tmp12 + tmp13, FIX(0.421479672));   /* c9 */
    tmp2 += tmp4 + tmp10 - MULTIPLY(tmp12, FIX(2.104122847)) /* c9+c5+c3-c7 */
	    + MULTIPLY(tmp14, FIX(1.480800167));         /* c1 */
    tmp3 += tmp5 + tmp10 + MULTIPLY(tmp13, FIX(1.381129125)) /* c1+c5-c9-c7 */
	    - MULTIPLY(tmp14, FIX(1.360834544));         /* c3 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+2);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+2);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3, CONST_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}